

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall
BN::expLeftToRightK_aryMod
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference bn;
  BN local_100;
  BN local_e8;
  ulong local_d0;
  size_t k_1;
  BN local_b0;
  BN local_88;
  BN local_70;
  long local_58;
  size_t k;
  size_t hi;
  ulong uStack_40;
  bt ei;
  size_t b;
  int i;
  vector<BN,_std::allocator<BN>_> *g_local;
  BN *mod_local;
  BN *exponent_local;
  BN *this_local;
  BN *A;
  
  _i = g;
  g_local = (vector<BN,_std::allocator<BN>_> *)mod;
  mod_local = exponent;
  exponent_local = this;
  this_local = __return_storage_ptr__;
  bVar1 = is0(exponent);
  if (bVar1) {
    bn1();
  }
  else {
    b._7_1_ = 0;
    bn1();
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&mod_local->ba);
    b._0_4_ = (int)sVar3;
    while (b._0_4_ = (int)b + -1, -1 < (int)b) {
      for (uStack_40 = 1; uStack_40 < 2; uStack_40 = uStack_40 - 1) {
        pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&mod_local->ba,(long)(int)b);
        uVar2 = (int)(uint)*pvVar4 >> ((byte)(uStack_40 << 3) & 0x1f);
        hi._6_2_ = (ushort)uVar2 & 0xff;
        k = 0;
        if ((uVar2 & 0xff) != 0) {
          for (; (hi._6_2_ & 1) == 0; hi._6_2_ = (ushort)((int)(uint)hi._6_2_ >> 1)) {
            k = k + 1;
          }
        }
        for (local_58 = 0; local_58 + k < 8; local_58 = local_58 + 1) {
          Qrt(&local_88,__return_storage_ptr__);
          operator%(&local_70,&local_88,(BN *)g_local);
          operator=(__return_storage_ptr__,&local_70);
          ~BN(&local_70);
          ~BN(&local_88);
        }
        bn = std::vector<BN,_std::allocator<BN>_>::operator[](_i,(ulong)hi._6_2_);
        operator*((BN *)&k_1,__return_storage_ptr__,bn);
        operator%(&local_b0,(BN *)&k_1,(BN *)g_local);
        operator=(__return_storage_ptr__,&local_b0);
        ~BN(&local_b0);
        ~BN((BN *)&k_1);
        for (local_d0 = 0; local_d0 < k; local_d0 = local_d0 + 1) {
          Qrt(&local_100,__return_storage_ptr__);
          operator%(&local_e8,&local_100,(BN *)g_local);
          operator=(__return_storage_ptr__,&local_e8);
          ~BN(&local_e8);
          ~BN(&local_100);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expLeftToRightK_aryMod(const BN& exponent, const BN& mod, const vector<BN>& g) const {
    if(exponent.is0())
        return BN::bn1();

    BN A(BN::bn1());
    for(int i = exponent.ba.size() - 1; i >= 0; i--) {
        for (size_t b = bz - 1; b < bz; --b) {
            bt ei = (exponent.ba[i] >> KaryBits * b) & KaryMask;

            size_t hi = 0;
            if(ei != 0) {
                while(! (ei & 1)) {
                    ei >>= 1;
                    hi++;
                }
            }

            for(size_t k = 0; k + hi < KaryBits; k++)
                A = A.Qrt() % mod;
            A = A * g[ei] % mod;
            for(size_t k = 0; k < hi; k++)
                A = A.Qrt() % mod;
        }
    }
    return A;

}